

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_long>::assign
          (SmallVectorImpl<unsigned_long> *this,size_type NumElts,unsigned_long *Elt)

{
  unsigned_long *__first;
  void *pvVar1;
  size_t sVar2;
  unsigned_long *Elt_local;
  size_type NumElts_local;
  SmallVectorImpl<unsigned_long> *this_local;
  
  clear(this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 < NumElts) {
    SmallVectorTemplateBase<unsigned_long,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_long,_true>,NumElts);
  }
  SmallVectorBase::set_size((SmallVectorBase *)this,NumElts);
  __first = (unsigned_long *)
            (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
            super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
  pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
           super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  std::uninitialized_fill<unsigned_long*,unsigned_long>
            (__first,(unsigned_long *)((long)pvVar1 + sVar2 * 8),Elt);
  return;
}

Assistant:

void assign(size_type NumElts, const T &Elt) {
    clear();
    if (this->capacity() < NumElts)
      this->grow(NumElts);
    this->set_size(NumElts);
    std::uninitialized_fill(this->begin(), this->end(), Elt);
  }